

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O0

void test_fonts(wins *wins_ar,int ar_len)

{
  bool bVar1;
  char *local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  Am_Style *local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined8 local_80;
  Am_Style *local_78;
  Am_Style *local_70;
  Am_Drawonable *local_68;
  undefined1 *local_60;
  Am_Drawonable *local_58;
  byte local_49;
  Am_Image_Array local_48 [8];
  Am_Style local_40 [8];
  Am_Style bs;
  Am_Style local_28 [8];
  Am_Drawonable *local_20;
  Am_Drawonable *the_font_win;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  the_font_win._4_4_ = ar_len;
  _i = wins_ar;
  for (the_font_win._0_4_ = 0; (int)the_font_win < the_font_win._4_4_;
      the_font_win._0_4_ = (int)the_font_win + 1) {
    local_68 = _i[(int)the_font_win].root;
    local_70 = local_28;
    Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
    local_d0 = local_70;
    local_e8 = "";
    local_80 = 0;
    local_88 = 1;
    local_90 = 0;
    local_98 = 0;
    local_a0 = 1;
    local_a8 = 0;
    local_b0 = 0;
    local_b8 = 1;
    local_c0 = 1;
    local_c8 = 0;
    local_d8 = 0;
    local_e0 = 1;
    local_60 = (undefined1 *)&local_e8;
    local_58 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_68)(local_68,400,0x32,200);
    Am_Style::~Am_Style(local_28);
    local_20 = local_58;
    _i[(int)the_font_win].font_win = local_58;
    (**(code **)(*(long *)local_58 + 0xa0))();
  }
  bVar1 = Am_Drawonable::Is_Color(_i->root);
  local_49 = 0;
  if (bVar1) {
    Am_Style::Am_Style(local_40,(Am_Style *)&Am_Red);
  }
  else {
    local_78 = (Am_Style *)local_48;
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)local_78,0x32);
    local_49 = 1;
    local_d0 = local_78;
    local_d8 = 0;
    local_e0 = 2;
    local_e8 = (char *)CONCAT44(local_e8._4_4_,2);
    Am_Style::Am_Style((Am_Style *)0x0,0,local_40,2,1,0,0,&Am_DEFAULT_DASH_LIST);
  }
  if ((local_49 & 1) != 0) {
    Am_Image_Array::~Am_Image_Array(local_48);
  }
  test_font_variety(_i,the_font_win._4_4_,(Am_Style *)&Am_No_Style,false);
  test_font_dimensions(_i,the_font_win._4_4_);
  test_char_dimensions(_i,the_font_win._4_4_);
  test_font_props(_i,the_font_win._4_4_);
  test_bogus_name(_i,the_font_win._4_4_);
  test_filled_and_inverted_text(_i,the_font_win._4_4_,local_40);
  Am_Style::~Am_Style(local_40);
  return;
}

Assistant:

void
test_fonts(wins *wins_ar, int ar_len)

{

  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *the_font_win =
        (wins_ar[i].root)->Create(400, FONT_WIN_TOP, 200, 575);
    wins_ar[i].font_win = the_font_win;
    the_font_win->Flush_Output();
  }

  // base styles of all screens on the style of the main screen.

  Am_Style bs = (bool)wins_ar[0].root->Is_Color()
                    ? Am_Red
                    : Am_Style(0.0f, 0.0f, 0.0f, 2, Am_CAP_BUTT, Am_JOIN_MITER,
                               Am_LINE_SOLID, Am_DEFAULT_DASH_LIST,
                               Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                               Am_FILL_POLY_EVEN_ODD, Am_Image_Array(50));

  test_font_variety(wins_ar, ar_len, Am_No_Style, false); // normal text
  //test_font_variety(wins_ar, ar_len, bs, false); // red background rect
  //test_font_variety(wins_ar, ar_len, bs, true); // inverted

  test_font_dimensions(wins_ar, ar_len);
  test_char_dimensions(wins_ar, ar_len);
  test_font_props(wins_ar, ar_len);
  test_bogus_name(wins_ar, ar_len);
  test_filled_and_inverted_text(wins_ar, ar_len, bs);
}